

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

int32_t try_to_int(string *s)

{
  char *pcVar1;
  int iVar2;
  unsigned_long_long uVar3;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,(string *)s);
  trim(&local_30,&local_50);
  std::__cxx11::string::operator=((string *)s,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (((s->_M_string_length < 3) || (pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 != '0')) ||
     ((byte)(pcVar1[1] | 0x20U) != 0x78)) {
    iVar2 = std::__cxx11::stoi(s,(size_t *)0x0,10);
  }
  else {
    uVar3 = std::__cxx11::stoull(s,(size_t *)0x0,0);
    iVar2 = (int)uVar3;
  }
  return iVar2;
}

Assistant:

inline std::int32_t try_to_int(std::string s) {
    s = trim(s);
    if (s.length() > 2 && s[0] == '0' && (s[1] == 'x' || s[1] == 'X')) {
        return static_cast<std::int32_t>(std::stoull(s, 0, 0));
    }
    else {
        return std::stoi(s);
    }
}